

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O2

void Extra_TruthExist(uint *pTruth,int nVars,int iVar)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar4 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar4 = 1;
  }
  if (iVar < nVars) {
    switch(iVar) {
    case 0:
      uVar10 = 0;
      uVar9 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        uVar4 = pTruth[uVar10];
        pTruth[uVar10] = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0xd5555555) * 2 | uVar4;
      }
      break;
    case 1:
      uVar10 = 0;
      uVar9 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        uVar4 = pTruth[uVar10];
        pTruth[uVar10] = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0xf3333333) * 4 | uVar4;
      }
      break;
    case 2:
      uVar10 = 0;
      uVar9 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        uVar4 = pTruth[uVar10];
        pTruth[uVar10] = (uVar4 & 0xf0f0f0f) << 4 | uVar4 >> 4 & 0xf0f0f0f | uVar4;
      }
      break;
    case 3:
      uVar10 = 0;
      uVar9 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        uVar4 = pTruth[uVar10];
        pTruth[uVar10] =
             ((uVar4 & 0xff00) << 8 | uVar4 << 0x18) >> 0x10 |
             (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8) << 0x10 | uVar4;
      }
      break;
    case 4:
      uVar10 = 0;
      uVar9 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar9 = uVar10;
      }
      for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        uVar4 = pTruth[uVar10];
        pTruth[uVar10] = uVar4 << 0x10 | uVar4 >> 0x10 | uVar4;
      }
      break;
    default:
      bVar5 = (char)iVar - 5;
      bVar3 = bVar5 & 0x1f;
      uVar7 = 1 << bVar3;
      iVar6 = 2 << (bVar5 & 0x1f);
      iVar8 = 0 << bVar3;
      uVar9 = 0;
      if (0 < (int)uVar7) {
        uVar9 = (ulong)uVar7;
      }
      for (; iVar8 < (int)uVar4; iVar8 = iVar8 + iVar6) {
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          uVar1 = pTruth[uVar10];
          uVar2 = pTruth[(long)(int)uVar7 + uVar10];
          pTruth[uVar10] = uVar1 | uVar2;
          pTruth[(long)(int)uVar7 + uVar10] = uVar1 | uVar2;
        }
        pTruth = pTruth + iVar6;
      }
    }
    return;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                ,0x1fb,"void Extra_TruthExist(unsigned int *, int, int)");
}

Assistant:

void Extra_TruthExist( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xAAAAAAAA) >> 1) | ((pTruth[i] & 0x55555555) << 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xCCCCCCCC) >> 2) | ((pTruth[i] & 0x33333333) << 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xF0F0F0F0) >> 4) | ((pTruth[i] & 0x0F0F0F0F) << 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xFF00FF00) >> 8) | ((pTruth[i] & 0x00FF00FF) << 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] |=  ((pTruth[i] & 0xFFFF0000) >> 16) | ((pTruth[i] & 0x0000FFFF) << 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pTruth[i]     |= pTruth[Step+i];
                pTruth[Step+i] = pTruth[i];
            }
            pTruth += 2*Step;
        }
        return;
    }
}